

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O3

void __thiscall S2RegionTermIndexer::~S2RegionTermIndexer(S2RegionTermIndexer *this)

{
  pointer pcVar1;
  
  S2RegionCoverer::~S2RegionCoverer(&this->coverer_);
  pcVar1 = (this->options_).marker_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).marker_.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

S2RegionTermIndexer::~S2RegionTermIndexer() = default;